

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_BeginPlay(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  DObject *this;
  bool bVar1;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else if (((param->field_0).field_3.Type == '\x03') && ((param->field_0).field_1.atag == 1)) {
    this = (DObject *)(param->field_0).field_1.a;
    bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    if (bVar1) {
      (*this->_vptr_DObject[10])(this);
      return 0;
    }
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
  }
  else {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x12a5,
                "int AF_AActor_BeginPlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, BeginPlay)
{
	PARAM_SELF_PROLOGUE(AActor);
	self->BeginPlay();
	return 0;
}